

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O3

QNetworkProxy __thiscall
QTcpServerPrivate::resolveProxy(QTcpServerPrivate *this,QHostAddress *address,quint16 port)

{
  int iVar1;
  bool bVar2;
  ProxyType PVar3;
  Capabilities CVar4;
  quint16 in_CX;
  undefined6 in_register_00000012;
  long lVar5;
  QNetworkProxy *this_00;
  long in_FS_OFFSET;
  QNetworkProxyQuery query;
  QString local_a8;
  QArrayDataPointer<QNetworkProxy> local_88;
  QArrayDataPointer<QNetworkProxy> local_68;
  QArrayDataPointer<QNetworkProxy> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHostAddress::isLoopback((QHostAddress *)CONCAT62(in_register_00000012,port));
  if (bVar2) {
    local_48.d = (Data *)0x0;
    local_48.ptr = (QNetworkProxy *)0x0;
    local_48.size = 0;
    local_68.size = 0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (QNetworkProxy *)0x0;
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (QNetworkProxy *)0x0;
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)this,NoProxy,(QString *)&local_48,0,(QString *)&local_68,
               (QString *)&local_88);
    if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    local_68.d = (Data *)0x0;
    local_68.ptr = (QNetworkProxy *)0x0;
    local_68.size = 0;
    PVar3 = QNetworkProxy::type((QNetworkProxy *)(address + 0x1c));
    if (PVar3 == DefaultProxy) {
      local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)0x0;
      local_48.ptr = (QNetworkProxy *)0x0;
      local_48.size = 0;
      QNetworkProxyQuery::QNetworkProxyQuery
                ((QNetworkProxyQuery *)&local_a8,in_CX,(QString *)&local_48,
                 (uint)(*(int *)&address[0x15].d.d.ptr == 2) * 2 + TcpServer);
      if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
        }
      }
      QNetworkProxyFactory::proxyForQuery
                ((QList<QNetworkProxy> *)&local_88,(QNetworkProxyQuery *)&local_a8);
      local_48.size = local_68.size;
      local_48.ptr = local_68.ptr;
      local_48.d = local_68.d;
      local_68.size = local_88.size;
      local_68.ptr = local_88.ptr;
      local_68.d = local_88.d;
      local_88.size = 0;
      local_88.d = (Data *)0x0;
      local_88.ptr = (QNetworkProxy *)0x0;
      QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_88);
      QNetworkProxyQuery::~QNetworkProxyQuery((QNetworkProxyQuery *)&local_a8);
    }
    else {
      QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy_const&>
                ((QMovableArrayOps<QNetworkProxy> *)&local_68,0,(QNetworkProxy *)(address + 0x1c));
      QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_68);
    }
    if (local_68.size != 0) {
      lVar5 = local_68.size << 3;
      this_00 = local_68.ptr;
      do {
        iVar1 = *(int *)&address[0x15].d.d.ptr;
        if (iVar1 == 0) {
          CVar4 = QNetworkProxy::capabilities(this_00);
          if (((uint)CVar4.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
                     super_QFlagsStorage<QNetworkProxy::Capability>.i & 2) == 0) {
            iVar1 = *(int *)&address[0x15].d.d.ptr;
            goto LAB_001c6686;
          }
LAB_001c6745:
          QNetworkProxy::QNetworkProxy((QNetworkProxy *)this,this_00);
          goto LAB_001c6750;
        }
LAB_001c6686:
        if (iVar1 == 2) {
          CVar4 = QNetworkProxy::capabilities(this_00);
          if (((uint)CVar4.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
                     super_QFlagsStorage<QNetworkProxy::Capability>.i & 0x40) != 0)
          goto LAB_001c6745;
        }
        this_00 = this_00 + 1;
        lVar5 = lVar5 + -8;
      } while (lVar5 != 0);
    }
    local_48.d = (Data *)0x0;
    local_48.ptr = (QNetworkProxy *)0x0;
    local_48.size = 0;
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (QNetworkProxy *)0x0;
    local_a8.d.size = 0;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)this,DefaultProxy,(QString *)&local_48,0,(QString *)&local_88,
               &local_a8);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
      }
    }
LAB_001c6750:
    QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSharedDataPointer<QNetworkProxyPrivate>)(QSharedDataPointer<QNetworkProxyPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkProxy QTcpServerPrivate::resolveProxy(const QHostAddress &address, quint16 port)
{
    if (address.isLoopback())
        return QNetworkProxy::NoProxy;

    QList<QNetworkProxy> proxies;
    if (proxy.type() != QNetworkProxy::DefaultProxy) {
        // a non-default proxy was set with setProxy
        proxies << proxy;
    } else {
        // try the application settings instead
        QNetworkProxyQuery query(port, QString(),
                                 socketType == QAbstractSocket::SctpSocket ?
                                 QNetworkProxyQuery::SctpServer :
                                 QNetworkProxyQuery::TcpServer);
        proxies = QNetworkProxyFactory::proxyForQuery(query);
    }

    // return the first that we can use
    for (const QNetworkProxy &p : std::as_const(proxies)) {
        if (socketType == QAbstractSocket::TcpSocket &&
            (p.capabilities() & QNetworkProxy::ListeningCapability) != 0)
            return p;

        if (socketType == QAbstractSocket::SctpSocket &&
            (p.capabilities() & QNetworkProxy::SctpListeningCapability) != 0)
            return p;
    }

    // no proxy found
    // DefaultProxy will raise an error
    return QNetworkProxy(QNetworkProxy::DefaultProxy);
}